

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Data_Query_PDU::AddFixedDatum(Data_Query_PDU *this,KUINT32 FD)

{
  KUINT16 *pKVar1;
  iterator __position;
  KUINT32 local_c;
  
  __position._M_current =
       (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_c = FD;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vFixedDatum,__position,
               &local_c);
  }
  else {
    *__position._M_current = FD;
    (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 4;
  this->m_ui32NumFixedDatum = this->m_ui32NumFixedDatum + 1;
  return;
}

Assistant:

void Data_Query_PDU::AddFixedDatum( KUINT32 FD )
{
    m_vFixedDatum.push_back( FD );
    m_ui16PDULength += 4; // Size of KUINT32
    ++m_ui32NumFixedDatum;
}